

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    iVar1 = (*this->_vptr_MapFieldBase[0xc])(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return CONCAT44(extraout_var,iVar1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  mutex_.Lock();
  size_t size = SpaceUsedExcludingSelfNoLock();
  mutex_.Unlock();
  return size;
}